

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O3

void __thiscall tcu::ThreadUtil::Event::setResult(Event *this,Result result)

{
  int iVar1;
  
  deMutex_lock((this->m_lock).m_mutex);
  this->m_result = result;
  deMutex_unlock((this->m_lock).m_mutex);
  if (0 < this->m_waiterCount) {
    iVar1 = 0;
    do {
      deSemaphore_increment((this->m_waiters).m_semaphore);
      iVar1 = iVar1 + 1;
    } while (iVar1 < this->m_waiterCount);
  }
  return;
}

Assistant:

void Event::setResult (Result result)
{
	m_lock.lock();
	DE_ASSERT(m_result == RESULT_NOT_READY);
	m_result = result;
	m_lock.unlock();

	for (int i = 0; i < m_waiterCount; i++)
		m_waiters.increment();
}